

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O2

void stbi_decode_DXT1_block(uchar *uncompressed,uchar *compressed)

{
  ushort uVar1;
  ulong uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  int b;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  int g;
  int r;
  
  local_4c = (uint)*(ushort *)compressed;
  uVar1 = *(ushort *)(compressed + 2);
  stbi_rgb_888_from_565(local_4c,&r,&g,&b);
  iVar9 = r;
  local_68 = (undefined1)r;
  local_48 = (ulong)(uint)g;
  local_67 = (undefined1)g;
  local_40 = (ulong)(uint)b;
  local_66 = (undefined1)b;
  local_65 = 0xff;
  stbi_rgb_888_from_565((uint)uVar1,&r,&g,&b);
  local_64 = (char)r;
  local_59 = 0xff;
  local_63 = (char)g;
  local_62 = (char)b;
  local_61 = 0xff;
  if (local_4c < uVar1 || local_4c == uVar1) {
    local_60 = (char)((r & 0xffU) + (iVar9 & 0xffU) >> 1);
    local_5f = (char)((g & 0xffU) + ((uint)local_48 & 0xff) >> 1);
    local_5e = (undefined1)((b & 0xffU) + ((uint)local_40 & 0xff) >> 1);
    local_5c = 0;
    local_5b = 0;
    local_5a = 0;
    local_59 = 0;
  }
  else {
    uVar1 = (ushort)r & 0xff;
    sVar3 = (short)(iVar9 & 0xffU);
    local_60 = (char)((ushort)(uVar1 + sVar3 * 2) / 3);
    uVar5 = (ushort)local_48 & 0xff;
    uVar4 = (ushort)g & 0xff;
    local_5f = (char)((ushort)(uVar4 + uVar5 * 2) / 3);
    uVar7 = (ushort)local_40 & 0xff;
    uVar6 = (ushort)b & 0xff;
    local_5e = (undefined1)((ushort)(uVar6 + uVar7 * 2) / 3);
    local_5c = (undefined1)((ushort)(sVar3 + uVar1 * 2) / 3);
    local_5b = (undefined1)((ushort)(uVar5 + uVar4 * 2) / 3);
    local_5a = (undefined1)((ushort)(uVar7 + uVar6 * 2) / 3);
  }
  local_5d = 0xff;
  uVar10 = 0x20;
  for (uVar11 = 0; uVar11 < 0x40; uVar11 = uVar11 + 4) {
    uVar2 = uVar10 >> 3;
    bVar8 = (byte)uVar10;
    uVar10 = (ulong)((int)uVar10 + 2);
    *(undefined4 *)(uncompressed + uVar11) =
         *(undefined4 *)(&local_68 + (ulong)(compressed[uVar2] >> (bVar8 & 6) & 3) * 4);
  }
  return;
}

Assistant:

void stbi_decode_DXT1_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*4];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	decode_colors[3] = 255;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[4] = r;
	decode_colors[5] = g;
	decode_colors[6] = b;
	decode_colors[7] = 255;
	if( c0 > c1 )
	{
		//	no alpha, 2 interpolated colors
		decode_colors[8] = (2*decode_colors[0] + decode_colors[4]) / 3;
		decode_colors[9] = (2*decode_colors[1] + decode_colors[5]) / 3;
		decode_colors[10] = (2*decode_colors[2] + decode_colors[6]) / 3;
		decode_colors[11] = 255;
		decode_colors[12] = (decode_colors[0] + 2*decode_colors[4]) / 3;
		decode_colors[13] = (decode_colors[1] + 2*decode_colors[5]) / 3;
		decode_colors[14] = (decode_colors[2] + 2*decode_colors[6]) / 3;
		decode_colors[15] = 255;
	} else
	{
		//	1 interpolated color, alpha
		decode_colors[8] = (decode_colors[0] + decode_colors[4]) / 2;
		decode_colors[9] = (decode_colors[1] + decode_colors[5]) / 2;
		decode_colors[10] = (decode_colors[2] + decode_colors[6]) / 2;
		decode_colors[11] = 255;
		decode_colors[12] = 0;
		decode_colors[13] = 0;
		decode_colors[14] = 0;
		decode_colors[15] = 0;
	}
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 4;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
		uncompressed[i+3] = decode_colors[idx+3];
	}
	//	done
}